

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall TiXmlNode::LinkEndChild(TiXmlNode *this,TiXmlNode *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  undefined4 extraout_var_03;
  long lVar3;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TiXmlNode **ppTVar4;
  TiXmlNode *node_2;
  TiXmlNode *pTVar5;
  TiXmlNode *node_3;
  TiXmlNode *node_1;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  
  pTVar5 = node;
  if (node->parent != (TiXmlNode *)0x0 && node->parent != this) {
    __assert_fail("node->parent == 0 || node->parent == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                  ,0xbc,"TiXmlNode *TiXmlNode::LinkEndChild(TiXmlNode *)");
  }
  do {
    iVar1 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar5);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar5);
      if (CONCAT44(extraout_var_00,iVar1) != 0) {
        lVar2 = 0;
        pTVar5 = node;
        goto LAB_0017f01b;
      }
      break;
    }
    ppTVar4 = &pTVar5->parent;
    pTVar5 = *ppTVar4;
  } while (*ppTVar4 != (TiXmlNode *)0x0);
  goto LAB_0017f079;
  while (pTVar5 = pTVar5->parent, pTVar5 != (TiXmlNode *)0x0) {
LAB_0017f01b:
    iVar1 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar5);
    if (CONCAT44(extraout_var_01,iVar1) != 0) {
      iVar1 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar5);
      lVar2 = CONCAT44(extraout_var_02,iVar1);
      break;
    }
  }
  lVar3 = 0;
  pTVar5 = this;
  do {
    iVar1 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar5);
    if (CONCAT44(extraout_var_03,iVar1) != 0) {
      iVar1 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar5);
      lVar3 = CONCAT44(extraout_var_04,iVar1);
      break;
    }
    pTVar5 = pTVar5->parent;
  } while (pTVar5 != (TiXmlNode *)0x0);
  if (lVar2 != lVar3) {
    __assert_fail("node->GetDocument() == 0 || node->GetDocument() == this->GetDocument()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                  ,0xbd,"TiXmlNode *TiXmlNode::LinkEndChild(TiXmlNode *)");
  }
LAB_0017f079:
  if (node->type == TINYXML_DOCUMENT) {
    (*(node->super_TiXmlBase)._vptr_TiXmlBase[1])(node);
    node = (TiXmlNode *)0x0;
    pTVar5 = this;
    do {
      iVar1 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar5);
      if (CONCAT44(extraout_var_05,iVar1) != 0) {
        iVar1 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar5);
        if (CONCAT44(extraout_var_06,iVar1) != 0) {
          while (iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this),
                CONCAT44(extraout_var_07,iVar1) == 0) {
            this = this->parent;
          }
          iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this);
          TiXmlDocument::SetError
                    ((TiXmlDocument *)CONCAT44(extraout_var_08,iVar1),0xf,(char *)0x0,
                     (TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
          return (TiXmlNode *)0x0;
        }
        return (TiXmlNode *)0x0;
      }
      pTVar5 = pTVar5->parent;
    } while (pTVar5 != (TiXmlNode *)0x0);
  }
  else {
    node->parent = this;
    pTVar5 = this->lastChild;
    node->prev = pTVar5;
    node->next = (TiXmlNode *)0x0;
    ppTVar4 = &pTVar5->next;
    if (pTVar5 == (TiXmlNode *)0x0) {
      ppTVar4 = &this->firstChild;
    }
    *ppTVar4 = node;
    this->lastChild = node;
  }
  return node;
}

Assistant:

TiXmlNode* TiXmlNode::LinkEndChild( TiXmlNode* node )
{
	assert( node->parent == 0 || node->parent == this );
	assert( node->GetDocument() == 0 || node->GetDocument() == this->GetDocument() );

	if ( node->Type() == TiXmlNode::TINYXML_DOCUMENT )
	{
		delete node;
		if ( GetDocument() ) 
			GetDocument()->SetError( TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	node->parent = this;

	node->prev = lastChild;
	node->next = 0;

	if ( lastChild )
		lastChild->next = node;
	else
		firstChild = node;			// it was an empty list.

	lastChild = node;
	return node;
}